

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_dpb.c
# Opt level: O3

MPP_RET h265e_dpb_init(H265eDpb **dpb)

{
  undefined1 auVar1 [16];
  H265eDpb *pHVar2;
  H265eRefPicListModification *pHVar3;
  RK_S32 *pRVar4;
  MPP_RET MVar5;
  long lVar6;
  undefined1 auVar7 [16];
  int iVar9;
  int iVar10;
  long lVar8;
  
  if (((byte)h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_dpb","enter\n","h265e_dpb_init");
  }
  if (dpb == (H265eDpb **)0x0) {
    _mpp_log_l(2,"h265e_dpb","invalid parameter %p \n","h265e_dpb_init",0);
    MVar5 = MPP_ERR_VALUE;
  }
  else {
    pHVar2 = (H265eDpb *)mpp_osal_calloc("h265e_dpb_init",0x9e0);
    if (pHVar2 == (H265eDpb *)0x0) {
      MVar5 = MPP_ERR_MALLOC;
    }
    else {
      lVar6 = 0;
      pHVar2->last_idr = 0;
      pHVar2->poc_cra = 0;
      pHVar2->max_ref_l0 = 1;
      pHVar2->max_ref_l1 = 0;
      (pHVar2->RpsList).lt_num = 0;
      (pHVar2->RpsList).st_num = 0;
      memset((pHVar2->RpsList).poc,0,0x300);
      pHVar3 = (H265eRefPicListModification *)mpp_osal_calloc("h265e_dpb_init",0x108);
      (pHVar2->RpsList).m_RefPicListModification = pHVar3;
      auVar1 = _DAT_00277a10;
      pRVar4 = &pHVar2->frame_list[0].slot_idx;
      iVar9 = (int)DAT_00296ee0;
      iVar10 = DAT_00296ee0._4_4_;
      auVar7 = _DAT_00277a00;
      do {
        if (SUB164(auVar7 ^ auVar1,4) == iVar10 && SUB164(auVar7 ^ auVar1,0) < iVar9) {
          *pRVar4 = (int)lVar6;
          pRVar4[0x18] = (int)lVar6 + 1;
        }
        lVar6 = lVar6 + 2;
        lVar8 = auVar7._8_8_;
        auVar7._0_8_ = auVar7._0_8_ + 2;
        auVar7._8_8_ = lVar8 + 2;
        pRVar4 = pRVar4 + 0x30;
      } while (lVar6 != 0x12);
      *dpb = pHVar2;
      MVar5 = MPP_OK;
      if (((byte)h265e_debug & 1) != 0) {
        MVar5 = MPP_OK;
        _mpp_log_l(4,"h265e_dpb","leave\n","h265e_dpb_init");
      }
    }
  }
  return MVar5;
}

Assistant:

MPP_RET h265e_dpb_init(H265eDpb **dpb)
{
    MPP_RET ret = MPP_OK;
    H265eDpb *p = NULL;
    RK_U32 i;

    h265e_dbg_func("enter\n");
    if (NULL == dpb) {
        mpp_err_f("invalid parameter %p \n", dpb);
        return MPP_ERR_VALUE;
    }

    p = mpp_calloc_size(H265eDpb, sizeof(H265eDpb));

    if (NULL == p)
        return MPP_ERR_MALLOC;

    p->last_idr = 0;
    p->poc_cra = 0;
    p->max_ref_l0 = 1;
    p->max_ref_l1 = 0;

    H265eRpsList *rps_list = &p->RpsList;

    rps_list->lt_num = 0;
    rps_list->st_num = 0;

    memset(rps_list->poc, 0, sizeof(rps_list->poc));

    rps_list->m_RefPicListModification = mpp_calloc(H265eRefPicListModification, 1);


    for (i = 0; i < MPP_ARRAY_ELEMS(p->frame_list); i++)
        p->frame_list[i].slot_idx = i;

    mpp_assert(dpb);
    *dpb = p;
    h265e_dbg_func("leave\n");
    return ret;
}